

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O1

void fm_eulerToQuat(float roll,float pitch,float yaw,float *quat)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  fVar2 = cosf(roll * 0.5);
  fVar3 = cosf(pitch * 0.5);
  fVar4 = cosf(yaw * 0.5);
  fVar5 = sinf(roll * 0.5);
  fVar6 = sinf(pitch * 0.5);
  fVar7 = sinf(yaw * 0.5);
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar7 * fVar2)),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(fVar3 * fVar4)));
  *quat = auVar1._0_4_;
  auVar8 = ZEXT416((uint)fVar2);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar3 * fVar7)),auVar8,
                           ZEXT416((uint)(fVar4 * fVar6)));
  quat[1] = auVar1._0_4_;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar6 * fVar5)),auVar8,
                           ZEXT416((uint)(fVar3 * fVar7)));
  quat[2] = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6 * fVar7)),auVar8,
                           ZEXT416((uint)(fVar3 * fVar4)));
  quat[3] = auVar1._0_4_;
  return;
}

Assistant:

void fm_eulerToQuat(float roll,float pitch,float yaw,float *quat) // convert euler angles to quaternion.
{
	roll  *= 0.5f;
	pitch *= 0.5f;
	yaw   *= 0.5f;

	float cr = cosf(roll);
	float cp = cosf(pitch);
	float cy = cosf(yaw);

	float sr = sinf(roll);
	float sp = sinf(pitch);
	float sy = sinf(yaw);

	float cpcy = cp * cy;
	float spsy = sp * sy;
	float spcy = sp * cy;
	float cpsy = cp * sy;

	quat[0]   = ( sr * cpcy - cr * spsy);
	quat[1]   = ( cr * spcy + sr * cpsy);
	quat[2]   = ( cr * cpsy - sr * spcy);
	quat[3]   = cr * cpcy + sr * spsy;
}